

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

bool __thiscall
r_comp::Compiler::read_function
          (Compiler *this,Ptr *node,bool enforce,Class *p,uint16_t write_index,
          uint16_t *extent_index,bool write)

{
  byte bVar1;
  uint16_t *extent_index_00;
  uint16_t write_index_00;
  bool bVar2;
  State SVar3;
  Atom *this_00;
  shared_ptr<r_comp::RepliStruct> local_1a0;
  allocator local_189;
  string local_188 [36];
  State local_164;
  shared_ptr<r_comp::RepliStruct> local_160;
  State local_150;
  undefined4 local_14c;
  State s;
  undefined1 local_138 [8];
  Class _p;
  shared_ptr<r_comp::RepliStruct> local_e0;
  shared_ptr<r_comp::RepliStruct> local_d0;
  Class local_c0;
  shared_ptr<r_comp::RepliStruct> local_78 [2];
  shared_ptr<r_comp::RepliStruct> local_58;
  byte local_41;
  uint16_t *puStack_40;
  bool write_local;
  uint16_t *extent_index_local;
  Class *pCStack_30;
  uint16_t write_index_local;
  Class *p_local;
  Ptr *pPStack_20;
  bool enforce_local;
  Ptr *node_local;
  Compiler *this_local;
  
  local_41 = write;
  puStack_40 = extent_index;
  extent_index_local._6_2_ = write_index;
  pCStack_30 = p;
  p_local._7_1_ = enforce;
  pPStack_20 = node;
  node_local = (Ptr *)this;
  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_58,node);
  bVar2 = read_nil_fid(this,&local_58,extent_index_local._6_2_,puStack_40,(bool)(local_41 & 1));
  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_58);
  if (bVar2) {
    this_local._7_1_ = 1;
  }
  else {
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr(local_78,node);
    write_index_00 = extent_index_local._6_2_;
    extent_index_00 = puStack_40;
    bVar1 = local_41;
    Class::Class(&local_c0,FUNCTION_ID);
    bVar2 = read_variable(this,local_78,write_index_00,extent_index_00,(bool)(bVar1 & 1),&local_c0);
    Class::~Class(&local_c0);
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(local_78);
    if (bVar2) {
      this_local._7_1_ = 1;
    }
    else {
      std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_d0,node);
      bVar2 = read_reference(this,&local_d0,extent_index_local._6_2_,puStack_40,(bool)(local_41 & 1)
                             ,FUNCTION_ID);
      std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_d0);
      if (bVar2) {
        this_local._7_1_ = 1;
      }
      else {
        std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_e0,node);
        bVar2 = read_wildcard(this,&local_e0,extent_index_local._6_2_,puStack_40,
                              (bool)(local_41 & 1));
        std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_e0);
        if (bVar2) {
          this_local._7_1_ = 1;
        }
        else {
          std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                    ((shared_ptr<r_comp::RepliStruct> *)&_p.type,node);
          bVar2 = read_tail_wildcard(this,(Ptr *)&_p.type,extent_index_local._6_2_,puStack_40,
                                     (bool)(local_41 & 1));
          std::shared_ptr<r_comp::RepliStruct>::~shared_ptr
                    ((shared_ptr<r_comp::RepliStruct> *)&_p.type);
          if (bVar2) {
            this_local._7_1_ = 1;
          }
          else {
            Class::Class((Class *)local_138,ANY);
            std::shared_ptr<r_comp::RepliStruct>::shared_ptr
                      ((shared_ptr<r_comp::RepliStruct> *)&s,node);
            bVar2 = function(this,(Ptr *)&s,(Class *)local_138);
            std::shared_ptr<r_comp::RepliStruct>::~shared_ptr((shared_ptr<r_comp::RepliStruct> *)&s)
            ;
            if (bVar2) {
              if ((local_41 & 1) != 0) {
                this_00 = r_code::vector<r_code::Atom>::operator[]
                                    ((vector<r_code::Atom> *)(this->current_object + 8),
                                     (ulong)extent_index_local._6_2_);
                r_code::Atom::operator=(this_00,(Atom *)local_138);
              }
              this_local._7_1_ = 1;
            }
            else {
              SVar3 = save_state(this);
              local_150._0_3_ = SVar3._0_3_;
              std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_160,node);
              bVar2 = expression(this,&local_160,FUNCTION_ID,extent_index_local._6_2_,puStack_40,
                                 (bool)(local_41 & 1));
              std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_160);
              if (bVar2) {
                this_local._7_1_ = 1;
              }
              else {
                local_164 = local_150;
                restore_state(this,local_150);
                if ((p_local._7_1_ & 1) == 0) {
                  this_local._7_1_ = 0;
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_188," error: expected a device function",&local_189);
                  std::shared_ptr<r_comp::RepliStruct>::shared_ptr(&local_1a0,node);
                  set_error(this,(string *)local_188,&local_1a0);
                  std::shared_ptr<r_comp::RepliStruct>::~shared_ptr(&local_1a0);
                  std::__cxx11::string::~string(local_188);
                  std::allocator<char>::~allocator((allocator<char> *)&local_189);
                  this_local._7_1_ = 0;
                }
              }
            }
            local_14c = 1;
            Class::~Class((Class *)local_138);
          }
        }
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Compiler::read_function(RepliStruct::Ptr node, bool enforce, const Class *p, uint16_t write_index, uint16_t &extent_index, bool write) // p always NULL
{
    if (read_nil_fid(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_variable(node, write_index, extent_index, write, FUNCTION_ID)) {
        return true;
    }

    if (read_reference(node, write_index, extent_index, write, FUNCTION_ID)) {
        return true;
    }

    if (read_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    if (read_tail_wildcard(node, write_index, extent_index, write)) {
        return true;
    }

    Class _p;

    if (function(node, _p)) { // TODO: _p shall be used to parse the args in the embedding expression
        if (write) {
            current_object->code[write_index] = _p.atom;
        }

        return true;
    }

    State s = save_state();

    if (expression(node, FUNCTION_ID, write_index, extent_index, write)) {
        return true;
    }

    restore_state(s);

    if (enforce) {
        set_error(" error: expected a device function", node);
        return false;
    }

    return false;
}